

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  long __off;
  stbi__context s;
  stbi__context sStack_108;
  
  __off = ftell((FILE *)f);
  stbi__start_file(&sStack_108,f);
  iVar1 = stbi__info_main(&sStack_108,x,y,comp);
  if (-1 < __off) {
    iVar2 = fseek((FILE *)f,__off,0);
    if (iVar2 == -1) {
      stbi__g_failure_reason = "fseek() error";
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   if (pos >= 0) {
      if (fseek(f,pos,SEEK_SET) == -1) return stbi__err("fseek() error", "File Seek Fail");
   }
   return r;
}